

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_from_stream.cc
# Opt level: O0

void __thiscall
sptk::InputSourceFromStream::InputSourceFromStream
          (InputSourceFromStream *this,bool zero_padding,int read_size,istream *input_stream)

{
  _func_int **in_RCX;
  undefined4 in_EDX;
  byte in_SIL;
  InputSourceInterface *in_RDI;
  
  InputSourceInterface::InputSourceInterface(in_RDI);
  in_RDI->_vptr_InputSourceInterface = (_func_int **)&PTR__InputSourceFromStream_00128ca8;
  *(byte *)&in_RDI[1]._vptr_InputSourceInterface = in_SIL & 1;
  *(undefined4 *)((long)&in_RDI[1]._vptr_InputSourceInterface + 4) = in_EDX;
  in_RDI[2]._vptr_InputSourceInterface = in_RCX;
  *(undefined1 *)&in_RDI[3]._vptr_InputSourceInterface = 1;
  if ((*(int *)((long)&in_RDI[1]._vptr_InputSourceInterface + 4) < 1) ||
     (in_RDI[2]._vptr_InputSourceInterface == (_func_int **)0x0)) {
    *(undefined1 *)&in_RDI[3]._vptr_InputSourceInterface = 0;
  }
  return;
}

Assistant:

InputSourceFromStream::InputSourceFromStream(bool zero_padding, int read_size,
                                             std::istream* input_stream)
    : zero_padding_(zero_padding),
      read_size_(read_size),
      input_stream_(input_stream),
      is_valid_(true) {
  if (read_size_ <= 0 || NULL == input_stream_) {
    is_valid_ = false;
    return;
  }
}